

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

int __thiscall absl::Cord::CompareImpl(Cord *this,Cord *rhs)

{
  int iVar1;
  uint uVar2;
  size_t size_to_compare;
  size_t size_to_compare_00;
  
  size_to_compare = InlineRep::size(&this->contents_);
  size_to_compare_00 = InlineRep::size(&rhs->contents_);
  if (size_to_compare == size_to_compare_00) {
    iVar1 = GenericCompare<int,absl::Cord>(this,rhs,size_to_compare);
    return iVar1;
  }
  if (size_to_compare < size_to_compare_00) {
    uVar2 = GenericCompare<int,absl::Cord>(this,rhs,size_to_compare);
    uVar2 = uVar2 | -(uint)(uVar2 == 0);
  }
  else {
    iVar1 = GenericCompare<int,absl::Cord>(this,rhs,size_to_compare_00);
    uVar2 = iVar1 + (uint)(iVar1 == 0);
  }
  return uVar2;
}

Assistant:

int Cord::CompareImpl(const Cord& rhs) const {
  return SharedCompareImpl(*this, rhs);
}